

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O2

bool __thiscall
Interpreter::belongToCondition
          (Interpreter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *condition_string_vector_arg,Command *condition_command_pointer_arg)

{
  long lVar1;
  long lVar2;
  Command *local_28;
  Command *condition_command_pointer_arg_local;
  
  if (this->is_if_command == false) {
    if (this->is_while_command != true) {
      return false;
    }
    lVar2 = 0x98;
    lVar1 = 0xb0;
  }
  else {
    lVar2 = 200;
    lVar1 = 0xe0;
  }
  local_28 = condition_command_pointer_arg;
  std::vector<Command_*,_std::allocator<Command_*>_>::push_back
            ((vector<Command_*,_std::allocator<Command_*>_> *)
             ((long)&(this->lexed_data_to_interpret).
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar1),&local_28);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::push_back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)&(this->lexed_data_to_interpret).
                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar2),
              condition_string_vector_arg);
  return true;
}

Assistant:

bool Interpreter::belongToCondition(vector<string> condition_string_vector_arg,
                                    Command *condition_command_pointer_arg) {
  if (this->is_if_command) {
    this->if_commands_pointers.push_back(condition_command_pointer_arg);
    this->if_strings_vectors.push_back(condition_string_vector_arg);
    return true;
  } else if (this->is_while_command) {
    this->while_commands_pointers.push_back(condition_command_pointer_arg);
    this->while_strings_vectors.push_back(condition_string_vector_arg);
    return true;
  } else return false;
}